

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Reader::readCStyleComment(Reader *this)

{
  Char CVar1;
  Reader *in_RDI;
  Char c;
  
  do {
    if (in_RDI->current_ == in_RDI->end_) break;
    CVar1 = getNextChar(in_RDI);
  } while ((CVar1 != '*') || (*in_RDI->current_ != '/'));
  CVar1 = getNextChar(in_RDI);
  return CVar1 == '/';
}

Assistant:

bool Reader::readCStyleComment() {
  while (current_ != end_) {
    Char c = getNextChar();
    if (c == '*' && *current_ == '/')
      break;
  }
  return getNextChar() == '/';
}